

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

void __thiscall
cs::compiler_type::process_brackets
          (compiler_type *this,deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *tokens)

{
  bool bVar1;
  int iVar2;
  signal_types sVar3;
  undefined8 uVar4;
  size_type sVar5;
  void *pvVar6;
  reference pvVar7;
  string *str;
  compiler_type *in_RSI;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *in_RDI;
  token_base **ptr;
  iterator __end1;
  iterator __begin1;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *__range1;
  deque<int,_std::allocator<int>_> blist_stack;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> btokens;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  blist;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> oldt;
  _Self *in_stack_fffffffffffffb18;
  compile_error *in_stack_fffffffffffffb20;
  compile_error *this_00;
  deque<int,_std::allocator<int>_> *in_stack_fffffffffffffb30;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *in_stack_fffffffffffffb38;
  token_sblist *in_stack_fffffffffffffb40;
  allocator *paVar8;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_fffffffffffffb70;
  undefined6 in_stack_fffffffffffffbe0;
  undefined1 in_stack_fffffffffffffbe6;
  exception in_stack_fffffffffffffbe7;
  string local_418 [39];
  undefined1 local_3f1;
  deque<int,_std::allocator<int>_> *local_3a0;
  undefined1 local_392;
  allocator local_391;
  string local_390 [38];
  undefined1 local_36a;
  allocator local_369;
  string local_368 [39];
  undefined1 local_341;
  void *local_2f0;
  undefined1 local_2e2;
  allocator local_2e1;
  string local_2e0 [38];
  undefined1 local_2ba;
  allocator local_2b9;
  string local_2b8 [39];
  undefined1 local_291;
  void *local_240;
  undefined1 local_232;
  allocator local_231;
  string local_230 [38];
  undefined1 local_20a;
  allocator local_209;
  string local_208 [36];
  undefined4 local_1e4;
  undefined4 local_1e0;
  undefined4 local_1dc;
  reference local_1d8;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_fffffffffffffe58;
  compiler_type *in_stack_fffffffffffffe60;
  allocator local_31;
  string local_30 [24];
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_ffffffffffffffe8;
  
  bVar1 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::empty
                    ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)0x1b2dc4);
  if (bVar1) {
    uVar4 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"Received empty token buffer.",&local_31);
    compile_error::compile_error(in_stack_fffffffffffffb20,(string *)in_stack_fffffffffffffb18);
    __cxa_throw(uVar4,&compile_error::typeinfo,compile_error::~compile_error);
  }
  process_empty_brackets(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)0x1b2ee3);
  std::swap<cs::token_base*,std::allocator<cs::token_base*>>
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_fffffffffffffb20
             ,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
              in_stack_fffffffffffffb18);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::clear
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_fffffffffffffb40
            );
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           *)0x1b2f12);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)0x1b2f21);
  std::deque<int,_std::allocator<int>_>::deque((deque<int,_std::allocator<int>_> *)0x1b2f30);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::begin
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_fffffffffffffb18
            );
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::end
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_fffffffffffffb18
            );
  do {
    bVar1 = std::operator!=((_Self *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
    if (!bVar1) {
      bVar1 = std::deque<int,_std::allocator<int>_>::empty
                        ((deque<int,_std::allocator<int>_> *)0x1b3b7e);
      if (!bVar1) {
        str = (string *)__cxa_allocate_exception(0x28);
        this_00 = (compile_error *)&stack0xfffffffffffffbe7;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_418,"Parentheses do not match.",(allocator *)this_00);
        compile_error::compile_error(this_00,str);
        __cxa_throw(str,&compile_error::typeinfo,compile_error::~compile_error);
      }
      std::deque<int,_std::allocator<int>_>::~deque
                ((deque<int,_std::allocator<int>_> *)in_stack_fffffffffffffb70);
      std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque
                (in_stack_fffffffffffffb70);
      std::
      deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
      ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                *)in_stack_fffffffffffffb70);
      std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque
                (in_stack_fffffffffffffb70);
      return;
    }
    local_1d8 = std::_Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**>::
                operator*((_Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**> *
                          )&stack0xfffffffffffffe50);
    iVar2 = (*(*local_1d8)->_vptr_token_base[2])();
    if (iVar2 != 3) goto LAB_001b3b18;
    sVar3 = token_signal::get_signal((token_signal *)*local_1d8);
    switch(sVar3) {
    case com_:
      sVar5 = std::deque<int,_std::allocator<int>_>::size
                        ((deque<int,_std::allocator<int>_> *)0x1b3ad1);
      if (sVar5 != 1) break;
      process_brackets(in_RSI,in_stack_ffffffffffffffe8);
      std::
      deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
      ::push_back((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                   *)in_stack_fffffffffffffb20,(value_type *)in_stack_fffffffffffffb18);
      std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::clear
                ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                 in_stack_fffffffffffffb40);
      goto LAB_001b3b5f;
    default:
      break;
    case slb_:
      local_1dc = 1;
      std::deque<int,_std::allocator<int>_>::push_front
                ((deque<int,_std::allocator<int>_> *)in_stack_fffffffffffffb20,
                 (value_type_conflict4 *)in_stack_fffffffffffffb18);
      sVar5 = std::deque<int,_std::allocator<int>_>::size
                        ((deque<int,_std::allocator<int>_> *)0x1b3072);
      if (sVar5 == 1) goto LAB_001b3b5f;
      break;
    case srb_:
      bVar1 = std::deque<int,_std::allocator<int>_>::empty
                        ((deque<int,_std::allocator<int>_> *)0x1b3126);
      if (bVar1) {
        local_20a = 1;
        uVar4 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_208,"Parentheses do not match.",&local_209);
        compile_error::compile_error(in_stack_fffffffffffffb20,(string *)in_stack_fffffffffffffb18);
        local_20a = 0;
        __cxa_throw(uVar4,&compile_error::typeinfo,compile_error::~compile_error);
      }
      pvVar7 = std::deque<int,_std::allocator<int>_>::front(in_stack_fffffffffffffb30);
      if (*pvVar7 != 1) {
        local_232 = 1;
        uVar4 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_230,"The parentheses type does not match.(Request Small Bracket)",
                   &local_231);
        compile_error::compile_error(in_stack_fffffffffffffb20,(string *)in_stack_fffffffffffffb18);
        local_232 = 0;
        __cxa_throw(uVar4,&compile_error::typeinfo,compile_error::~compile_error);
      }
      std::deque<int,_std::allocator<int>_>::pop_front
                ((deque<int,_std::allocator<int>_> *)in_stack_fffffffffffffb20);
      bVar1 = std::deque<int,_std::allocator<int>_>::empty
                        ((deque<int,_std::allocator<int>_> *)0x1b3337);
      if (bVar1) {
        process_brackets(in_RSI,in_stack_ffffffffffffffe8);
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::push_back((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                     *)in_stack_fffffffffffffb20,(value_type *)in_stack_fffffffffffffb18);
        pvVar6 = token_base::operator_new((size_t)in_stack_fffffffffffffb20);
        local_291 = 1;
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                 *)CONCAT17(in_stack_fffffffffffffbe7,
                            CONCAT16(in_stack_fffffffffffffbe6,in_stack_fffffffffffffbe0)),in_RDI);
        token_sblist::token_sblist(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
        local_291 = 0;
        local_240 = pvVar6;
        std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::push_back
                  ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                   in_stack_fffffffffffffb20,(value_type *)in_stack_fffffffffffffb18);
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                  *)in_stack_fffffffffffffb70);
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::clear((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                 *)in_stack_fffffffffffffb40);
        std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::clear
                  ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                   in_stack_fffffffffffffb40);
        goto LAB_001b3b5f;
      }
      break;
    case mlb_:
      local_1e0 = 2;
      std::deque<int,_std::allocator<int>_>::push_front
                ((deque<int,_std::allocator<int>_> *)in_stack_fffffffffffffb20,
                 (value_type_conflict4 *)in_stack_fffffffffffffb18);
      sVar5 = std::deque<int,_std::allocator<int>_>::size
                        ((deque<int,_std::allocator<int>_> *)0x1b30ca);
      goto joined_r0x001b310d;
    case mrb_:
      bVar1 = std::deque<int,_std::allocator<int>_>::empty
                        ((deque<int,_std::allocator<int>_> *)0x1b3478);
      if (bVar1) {
        local_2ba = 1;
        uVar4 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2b8,"Parentheses do not match.",&local_2b9);
        compile_error::compile_error(in_stack_fffffffffffffb20,(string *)in_stack_fffffffffffffb18);
        local_2ba = 0;
        __cxa_throw(uVar4,&compile_error::typeinfo,compile_error::~compile_error);
      }
      pvVar7 = std::deque<int,_std::allocator<int>_>::front(in_stack_fffffffffffffb30);
      if (*pvVar7 != 2) {
        local_2e2 = 1;
        uVar4 = __cxa_allocate_exception(0x28);
        paVar8 = &local_2e1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_2e0,"The parentheses type does not match.(Request Middle Bracket)",paVar8);
        compile_error::compile_error(in_stack_fffffffffffffb20,(string *)in_stack_fffffffffffffb18);
        local_2e2 = 0;
        __cxa_throw(uVar4,&compile_error::typeinfo,compile_error::~compile_error);
      }
      std::deque<int,_std::allocator<int>_>::pop_front
                ((deque<int,_std::allocator<int>_> *)in_stack_fffffffffffffb20);
      bVar1 = std::deque<int,_std::allocator<int>_>::empty
                        ((deque<int,_std::allocator<int>_> *)0x1b3665);
      if (bVar1) {
        process_brackets(in_RSI,in_stack_ffffffffffffffe8);
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::push_back((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                     *)in_stack_fffffffffffffb20,(value_type *)in_stack_fffffffffffffb18);
        pvVar6 = token_base::operator_new((size_t)in_stack_fffffffffffffb20);
        local_341 = 1;
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                 *)CONCAT17(in_stack_fffffffffffffbe7,
                            CONCAT16(in_stack_fffffffffffffbe6,in_stack_fffffffffffffbe0)),in_RDI);
        token_mblist::token_mblist
                  ((token_mblist *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
        local_341 = 0;
        local_2f0 = pvVar6;
        std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::push_back
                  ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                   in_stack_fffffffffffffb20,(value_type *)in_stack_fffffffffffffb18);
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                  *)in_stack_fffffffffffffb70);
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::clear((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                 *)in_stack_fffffffffffffb40);
        std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::clear
                  ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                   in_stack_fffffffffffffb40);
        goto LAB_001b3b5f;
      }
      break;
    case llb_:
      local_1e4 = 3;
      std::deque<int,_std::allocator<int>_>::push_front
                ((deque<int,_std::allocator<int>_> *)in_stack_fffffffffffffb20,
                 (value_type_conflict4 *)in_stack_fffffffffffffb18);
      sVar5 = std::deque<int,_std::allocator<int>_>::size
                        ((deque<int,_std::allocator<int>_> *)0x1b3109);
joined_r0x001b310d:
      if (sVar5 != 1) break;
      goto LAB_001b3b5f;
    case lrb_:
      bVar1 = std::deque<int,_std::allocator<int>_>::empty
                        ((deque<int,_std::allocator<int>_> *)0x1b37a6);
      if (bVar1) {
        local_36a = 1;
        uVar4 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_368,"Parentheses do not match.",&local_369);
        compile_error::compile_error(in_stack_fffffffffffffb20,(string *)in_stack_fffffffffffffb18);
        local_36a = 0;
        __cxa_throw(uVar4,&compile_error::typeinfo,compile_error::~compile_error);
      }
      pvVar7 = std::deque<int,_std::allocator<int>_>::front(in_stack_fffffffffffffb30);
      if (*pvVar7 != 3) {
        local_392 = 1;
        uVar4 = __cxa_allocate_exception(0x28);
        paVar8 = &local_391;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_390,"The parentheses type does not match.(Request Large Bracket)",paVar8);
        compile_error::compile_error(in_stack_fffffffffffffb20,(string *)in_stack_fffffffffffffb18);
        local_392 = 0;
        __cxa_throw(uVar4,&compile_error::typeinfo,compile_error::~compile_error);
      }
      std::deque<int,_std::allocator<int>_>::pop_front
                ((deque<int,_std::allocator<int>_> *)in_stack_fffffffffffffb20);
      bVar1 = std::deque<int,_std::allocator<int>_>::empty
                        ((deque<int,_std::allocator<int>_> *)0x1b3993);
      if (bVar1) {
        process_brackets(in_RSI,in_stack_ffffffffffffffe8);
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::push_back((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                     *)in_stack_fffffffffffffb20,(value_type *)in_stack_fffffffffffffb18);
        in_stack_fffffffffffffb30 =
             (deque<int,_std::allocator<int>_> *)
             token_base::operator_new((size_t)in_stack_fffffffffffffb20);
        local_3f1 = 1;
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                 *)CONCAT17(in_stack_fffffffffffffbe7,
                            CONCAT16(in_stack_fffffffffffffbe6,in_stack_fffffffffffffbe0)),in_RDI);
        token_lblist::token_lblist
                  ((token_lblist *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
        local_3f1 = 0;
        local_3a0 = in_stack_fffffffffffffb30;
        std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::push_back
                  ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                   in_stack_fffffffffffffb20,(value_type *)in_stack_fffffffffffffb18);
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                  *)in_stack_fffffffffffffb70);
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::clear((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                 *)in_stack_fffffffffffffb40);
        std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::clear
                  ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                   in_stack_fffffffffffffb40);
        goto LAB_001b3b5f;
      }
    }
LAB_001b3b18:
    bVar1 = std::deque<int,_std::allocator<int>_>::empty
                      ((deque<int,_std::allocator<int>_> *)0x1b3b25);
    if (bVar1) {
      std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::push_back
                ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                 in_stack_fffffffffffffb20,(value_type *)in_stack_fffffffffffffb18);
    }
    else {
      std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::push_back
                ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                 in_stack_fffffffffffffb20,(value_type *)in_stack_fffffffffffffb18);
    }
LAB_001b3b5f:
    std::_Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**>::operator++
              ((_Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**> *)
               in_stack_fffffffffffffb20);
  } while( true );
}

Assistant:

void compiler_type::process_brackets(std::deque<token_base *> &tokens)
	{
		if (tokens.empty())
			throw compile_error("Received empty token buffer.");
		process_empty_brackets(tokens);
		std::deque<token_base *> oldt;
		std::swap(tokens, oldt);
		tokens.clear();
		std::deque<std::deque<token_base *>> blist;
		std::deque<token_base *> btokens;
		std::deque<int> blist_stack;
		for (auto &ptr: oldt) {
			if (ptr->get_type() == token_types::signal) {
				switch (static_cast<token_signal *>(ptr)->get_signal()) {
				default:
					break;
				case signal_types::slb_:
					blist_stack.push_front(1);
					if (blist_stack.size() == 1)
						continue;
					break;
				case signal_types::mlb_:
					blist_stack.push_front(2);
					if (blist_stack.size() == 1)
						continue;
					break;
				case signal_types::llb_:
					blist_stack.push_front(3);
					if (blist_stack.size() == 1)
						continue;
					break;
				case signal_types::srb_:
					if (blist_stack.empty())
						throw compile_error("Parentheses do not match.");
					if (blist_stack.front() != 1)
						throw compile_error("The parentheses type does not match.(Request Small Bracket)");
					blist_stack.pop_front();
					if (blist_stack.empty()) {
						process_brackets(btokens);
						blist.push_back(btokens);
						tokens.push_back(new token_sblist(blist));
						blist.clear();
						btokens.clear();
						continue;
					}
					break;
				case signal_types::mrb_:
					if (blist_stack.empty())
						throw compile_error("Parentheses do not match.");
					if (blist_stack.front() != 2)
						throw compile_error("The parentheses type does not match.(Request Middle Bracket)");
					blist_stack.pop_front();
					if (blist_stack.empty()) {
						process_brackets(btokens);
						blist.push_back(btokens);
						tokens.push_back(new token_mblist(blist));
						blist.clear();
						btokens.clear();
						continue;
					}
					break;
				case signal_types::lrb_:
					if (blist_stack.empty())
						throw compile_error("Parentheses do not match.");
					if (blist_stack.front() != 3)
						throw compile_error("The parentheses type does not match.(Request Large Bracket)");
					blist_stack.pop_front();
					if (blist_stack.empty()) {
						process_brackets(btokens);
						blist.push_back(btokens);
						tokens.push_back(new token_lblist(blist));
						blist.clear();
						btokens.clear();
						continue;
					}
					break;
				case signal_types::com_:
					if (blist_stack.size() == 1) {
						process_brackets(btokens);
						blist.push_back(btokens);
						btokens.clear();
						continue;
					}
					break;
				}
			}
			if (blist_stack.empty())
				tokens.push_back(ptr);
			else
				btokens.push_back(ptr);
		}
		if (!blist_stack.empty())
			throw compile_error("Parentheses do not match.");
	}